

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O1

void __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::~directed_flag_complex_in_memory_t
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this)

{
  pointer pdVar1;
  pointer pdVar2;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> p;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> local_38;
  
  pdVar1 = (this->vertex_cells).
           super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pdVar2 = (this->vertex_cells).
                super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    local_38.children = pdVar2->children;
    local_38.vertex = pdVar2->vertex;
    local_38._2_2_ = *(undefined2 *)&pdVar2->field_0x2;
    local_38.data.first = (pdVar2->data).first;
    local_38._8_8_ = *(undefined8 *)&(pdVar2->data).second;
    directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::free_memory(&local_38);
  }
  pdVar2 = (this->vertex_cells).
           super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->vertex_cells).
                                 super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  return;
}

Assistant:

~directed_flag_complex_in_memory_t() {
		for (auto p : vertex_cells) p.free_memory();
	}